

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
* __thiscall
obx::Query<objectbox::tsdemo::SensorValues>::findUniquePtrs
          (vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
           *__return_storage_ptr__,Query<objectbox::tsdemo::SensorValues> *this)

{
  OBX_query *pOVar1;
  CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues> visitor;
  vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
  local_28;
  
  pOVar1 = (this->super_QueryBase).cQuery_;
  if (pOVar1 != (OBX_query *)0x0) {
    local_28.
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    obx_query_visit(pOVar1,anon_unknown_3::
                           CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::visit);
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_28.
         super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_28.
         super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28.
         super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28.
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.
    super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ::~vector(&local_28);
    return __return_storage_ptr__;
  }
  internal::throwIllegalStateException("State condition failed: ","cQuery_");
}

Assistant:

std::vector<std::unique_ptr<EntityT>> findUniquePtrs() {
        OBX_VERIFY_STATE(cQuery_);

        CollectingVisitorUniquePtr<EntityT> visitor;
        obx_query_visit(cQuery_, CollectingVisitorUniquePtr<EntityT>::visit, &visitor);
        return std::move(visitor.items);
    }